

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::RenderDeviceGLImpl::CreateTLAS
          (RenderDeviceGLImpl *this,TopLevelASDesc *Desc,ITopLevelAS **ppTLAS)

{
  Char *Message;
  undefined1 local_40 [8];
  string msg;
  ITopLevelAS **ppTLAS_local;
  TopLevelASDesc *Desc_local;
  RenderDeviceGLImpl *this_local;
  
  msg.field_2._8_8_ = ppTLAS;
  FormatString<char[38]>((string *)local_40,(char (*) [38])"CreateTLAS is not supported in OpenGL");
  Message = (Char *)std::__cxx11::string::c_str();
  DebugAssertionFailed
            (Message,"CreateTLAS",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
             ,0x275);
  std::__cxx11::string::~string((string *)local_40);
  *(undefined8 *)msg.field_2._8_8_ = 0;
  return;
}

Assistant:

void RenderDeviceGLImpl::CreateTLAS(const TopLevelASDesc& Desc,
                                    ITopLevelAS**         ppTLAS)
{
    UNSUPPORTED("CreateTLAS is not supported in OpenGL");
    *ppTLAS = nullptr;
}